

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O3

void __thiscall MTRand::reload(MTRand *this)

{
  uint *puVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint32 *p;
  uint uVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [16];
  undefined1 auVar11 [12];
  undefined1 auVar12 [16];
  
  uVar8 = (uint)this->state[0];
  lVar5 = 0;
  do {
    lVar4 = lVar5;
    uVar6 = uVar8 & 0x80000000;
    uVar8 = *(uint *)((long)this->state + lVar4 + 8);
    *(ulong *)((long)this->state + lVar4) =
         (ulong)(-(uVar8 & 1) & 0x9908b0df) ^
         (ulong)((uVar8 & 0x7ffffffe | uVar6) >> 1) ^ *(ulong *)((long)this->state + lVar4 + 0xc68);
    auVar3 = _DAT_00104050;
    lVar5 = lVar4 + 8;
  } while ((int)lVar5 != 0x718);
  lVar7 = 1;
  do {
    puVar1 = (uint *)((long)this->state + lVar7 * 8 + lVar5);
    uVar6 = *puVar1;
    uVar2 = puVar1[2];
    auVar9._0_4_ = uVar8 & 0x80000000;
    auVar9._4_4_ = 0;
    auVar9._8_4_ = uVar6 & 0x80000000;
    auVar11._0_4_ = uVar6 & 0x7ffffffe;
    auVar11._4_4_ = 0;
    auVar11._8_4_ = uVar2 & 0x7ffffffe;
    auVar12._0_8_ = SUB128(auVar11 | auVar9,0) >> 1;
    auVar12._8_4_ = SUB124(auVar11 | auVar9,8) >> 1;
    auVar12._12_4_ = 0;
    auVar10._0_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
    auVar10._4_4_ = (int)(puVar1[1] << 0x1f) >> 0x1f;
    auVar10._8_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
    auVar10._12_4_ = (int)(puVar1[3] << 0x1f) >> 0x1f;
    *(undefined1 (*) [16])((long)this->state + lVar7 * 8 + lVar4) =
         auVar10 & auVar3 ^ *(undefined1 (*) [16])((long)this + lVar7 * 8 + lVar4 + -0x718) ^
         auVar12;
    lVar7 = lVar7 + 2;
    uVar8 = uVar2;
  } while (lVar7 != 0x18d);
  uVar8 = (uint)this->state[0];
  *(ulong *)((long)this->state + lVar4 + 0xc68) =
       (ulong)(-(uVar8 & 1) & 0x9908b0df) ^
       (ulong)((uVar8 & 0x7ffffffe | uVar2 & 0x80000000) >> 1) ^
       *(ulong *)((long)this->state + lVar4 + 0x550);
  this->left = 0x270;
  this->pNext = this->state;
  return;
}

Assistant:

void MTRand::reload() {
  // Generate N new values in state
  // Made clearer and faster by Matthew Bellew (matthew.bellew@home.com)
  uint32 *p = state;
  int i;
  for (i = N - M; i--; ++p)
    *p = twist(p[M], p[0], p[1]);
  for (i = M; --i; ++p)
    *p = twist(p[M - N], p[0], p[1]);
  *p = twist(p[M - N], p[0], state[0]);

  left = N, pNext = state;
}